

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_set_nested_(int *flag)

{
  kmp_info_t *thread_00;
  int *in_RDI;
  kmp_info_t *thread;
  
  thread_00 = __kmp_entry_thread();
  __kmp_save_internal_controls(thread_00);
  (((thread_00->th).th_current_task)->td_icvs).nested = *in_RDI != 0;
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_NESTED)(int KMP_DEREF flag) {
#ifdef KMP_STUB
  __kmps_set_nested(KMP_DEREF flag);
#else
  kmp_info_t *thread;
  /* For the thread-private internal controls implementation */
  thread = __kmp_entry_thread();
  __kmp_save_internal_controls(thread);
  set__nested(thread, ((KMP_DEREF flag) ? TRUE : FALSE));
#endif
}